

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall
Minisat::Solver::safeRemoveSatisfied(Solver *this,vec<unsigned_int> *cs,uint valid_mark)

{
  uint cr;
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int local_34;
  
  iVar4 = cs->sz;
  if (iVar4 < 1) {
    local_34 = 0;
  }
  else {
    lVar6 = 0;
    local_34 = 0;
    do {
      puVar1 = cs->data;
      cr = puVar1[lVar6];
      puVar2 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      if ((puVar2[cr] & 3) == valid_mark) {
        bVar3 = satisfied(this,(Clause *)(puVar2 + cr));
        if (bVar3) {
          removeSatisfiedClause(this,cr,true);
        }
        else {
          lVar5 = (long)local_34;
          local_34 = local_34 + 1;
          puVar1[lVar5] = cr;
        }
      }
      lVar6 = lVar6 + 1;
      iVar4 = cs->sz;
    } while (lVar6 < iVar4);
    local_34 = (int)lVar6 - local_34;
  }
  if (0 < local_34) {
    cs->sz = iVar4 - local_34;
  }
  return;
}

Assistant:

void Solver::safeRemoveSatisfied(vec<CRef> &cs, unsigned valid_mark)
{
    int i, j;
    for (i = j = 0; i < cs.size(); i++) {
        Clause &c = ca[cs[i]];
        if (c.mark() == valid_mark) {
            if (satisfied(c)) {
                removeSatisfiedClause(cs[i]);
            } else {
                cs[j++] = cs[i];
            }
        }
    }
    cs.shrink(i - j);
}